

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

FloatParts scalbn_decomposed(FloatParts a,int n,float_status *s)

{
  int iVar1;
  ulong uVar2;
  FloatParts FVar3;
  
  uVar2 = a._8_8_;
  if (((undefined1  [16])a & (undefined1  [16])0xfc00000000) == (undefined1  [16])0x0) {
    if ((uVar2 & 0x300000000) == 0x200000000) {
      iVar1 = -0x10000;
      if (-0x10000 < n) {
        iVar1 = n;
      }
      if (0xffff < iVar1) {
        iVar1 = 0x10000;
      }
      uVar2 = uVar2 & 0xffffff0200000000 | (ulong)(uint)(iVar1 + a.exp);
    }
    FVar3.exp = (int)uVar2;
    FVar3.cls = (char)(uVar2 >> 0x20);
    FVar3.sign = (_Bool)(char)(uVar2 >> 0x28);
    FVar3._14_2_ = (short)(uVar2 >> 0x30);
    FVar3.frac = a.frac;
    return FVar3;
  }
  FVar3 = return_nan(a,s);
  return FVar3;
}

Assistant:

static FloatParts scalbn_decomposed(FloatParts a, int n, float_status *s)
{
    if (unlikely(is_nan(a.cls))) {
        return return_nan(a, s);
    }
    if (a.cls == float_class_normal) {
        /* The largest float type (even though not supported by FloatParts)
         * is float128, which has a 15 bit exponent.  Bounding N to 16 bits
         * still allows rounding to infinity, without allowing overflow
         * within the int32_t that backs FloatParts.exp.
         */
        n = MIN(MAX(n, -0x10000), 0x10000);
        a.exp += n;
    }
    return a;
}